

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O1

uchar * mcmrealo(mcmcxdef *cctx,mcmon cliobj,ushort newsize)

{
  ushort n;
  undefined2 uVar1;
  mcmcx1def *ctx;
  uint uVar2;
  uchar *__dest;
  ulong uVar3;
  ushort uVar4;
  undefined6 in_register_00000032;
  long *plVar5;
  mcmodef *pmVar6;
  mcmon nxt;
  errdef fr_;
  ushort local_17c;
  mcmon local_17a;
  mcmcx1def *local_178;
  mcmcxdef *local_170;
  errdef local_168;
  
  local_178 = cctx->mcmcxgl;
  n = cctx->mcmcxmtb[CONCAT62(in_register_00000032,cliobj) >> 8 & 0xffffff]
      [(uint)CONCAT62(in_register_00000032,cliobj) & 0xff];
  pmVar6 = local_178->mcmcxtab[n >> 8];
  uVar3 = (ulong)((n & 0xff) << 5);
  uVar4 = *(ushort *)((long)&pmVar6->mcmoflg + uVar3);
  local_17a = cliobj;
  if ((uVar4 & 4) == 0) {
    mcmlck(cctx,cliobj);
  }
  local_170 = cctx;
  local_168.errcode = _setjmp((__jmp_buf_tag *)local_168.errbuf);
  ctx = local_178;
  if (local_168.errcode != 0) {
    local_178->mcmcxerr->errcxptr = local_168.errprv;
    if ((uVar4 & 4) == 0) {
      mcmunlck(local_170,local_17a);
    }
    errrse1(local_178->mcmcxerr,&local_168);
  }
  uVar4 = (ushort)(newsize + 7) & 0xfff8;
  plVar5 = (long *)((long)&pmVar6->mcmoptr + uVar3);
  local_168.errprv = local_178->mcmcxerr->errcxptr;
  local_178->mcmcxerr->errcxptr = &local_168;
  uVar2 = newsize + 7 & 0xfff8;
  if (uVar2 < *(ushort *)(plVar5 + 3)) {
LAB_0012cdd6:
    mcmsplt(ctx,n,uVar4);
  }
  else {
    local_17c = *(ushort *)(*plVar5 + (ulong)*(ushort *)(plVar5 + 3));
    if (local_17c == 0xffff) {
      pmVar6 = (mcmodef *)0x0;
    }
    else {
      pmVar6 = local_178->mcmcxtab[local_17c >> 8] + (byte)local_17c;
    }
    if ((pmVar6 != (mcmodef *)0x0) && ((pmVar6->mcmoflg & 0x80) != 0)) {
      if ((int)(uVar2 - *(ushort *)(plVar5 + 3)) <= (int)(uint)pmVar6->mcmosiz) {
        *(ushort *)(plVar5 + 3) = pmVar6->mcmosiz + 8 + *(ushort *)(plVar5 + 3);
        mcmunl(local_178,local_17c,&local_178->mcmcxfre);
        pmVar6->mcmonxt = ctx->mcmcxunu;
        ctx->mcmcxunu = local_17c;
        pmVar6->mcmoflg = 0;
        goto LAB_0012cdd6;
      }
    }
    if (*(char *)((long)plVar5 + 0x16) != '\x01') {
      errsigf(local_178->mcmcxerr,"TADS",5);
    }
    __dest = mcmalo0(local_170,uVar4,&local_17c,0xffff,1);
    if (local_17c == 0xffff) {
      errsigf(ctx->mcmcxerr,"TADS",0xc);
    }
    memcpy(__dest,(void *)*plVar5,(ulong)*(ushort *)(plVar5 + 3));
    pmVar6 = ctx->mcmcxtab[local_17c >> 8];
    uVar3 = (ulong)((local_17c & 0xff) << 5);
    uVar1 = *(undefined2 *)((long)&pmVar6->mcmosiz + uVar3);
    *(long *)((long)&pmVar6->mcmoptr + uVar3) = *plVar5;
    *(short *)((long)&pmVar6->mcmosiz + uVar3) = (short)plVar5[3];
    *plVar5 = (long)__dest;
    *(undefined2 *)(plVar5 + 3) = uVar1;
    *(ushort *)(__dest + -8) = n;
    *(ushort *)(*(long *)((long)&pmVar6->mcmoptr + uVar3) + -8) = local_17c;
    mcmgunlck(ctx,local_17c);
    mcmgfre(ctx,local_17c);
  }
  ctx->mcmcxerr->errcxptr = local_168.errprv;
  return (uchar *)*plVar5;
}

Assistant:

uchar *mcmrealo(mcmcxdef *cctx, mcmon cliobj, ushort newsize)
{
    mcmcx1def *ctx = cctx->mcmcxgl;                       /* global context */
    mcmon      obj = mcmc2g(cctx, cliobj); 
    mcmodef   *o = mcmgobje(ctx, obj);
    mcmon      nxt;
    mcmodef   *nxto;
    uchar     *p;
    int        local_lock;
    
    MCMCLICTX(cctx);
    MCMGLBCTX(ctx);
    
    newsize = osrndsz(newsize);
    
    /* make sure the object is locked, and note if we locked it */
    if ((local_lock = !(o->mcmoflg & MCMOFLOCK)) != 0)
        (void)mcmlck(cctx, cliobj);
    
    ERRBEGIN(ctx->mcmcxerr)
    
    if (newsize < o->mcmosiz)
        mcmsplt(ctx, obj, newsize);            /* smaller; just split block */
    else
    {
        /* see if there's a free block after this block */
        p = o->mcmoptr;
        nxt = *(mcmon *)(p + o->mcmosiz);
        nxto = (nxt == MCMONINV) ? (mcmodef *)0 : mcmgobje(ctx, nxt);
        
        if (nxto && ((nxto->mcmoflg & MCMOFFREE)
                     && nxto->mcmosiz >= newsize - o->mcmosiz))
        {
            /* sanity check - make sure heap and page table agree */
            assert(nxto->mcmoptr == p + o->mcmosiz + osrndsz(sizeof(mcmon)));
            /* annex the free block */
            o->mcmosiz += nxto->mcmosiz + osrndsz(sizeof(mcmon));
            /* move the free block to the unused list */
            mcmunl(ctx, nxt, &ctx->mcmcxfre);
            nxto->mcmonxt = ctx->mcmcxunu;
            ctx->mcmcxunu = nxt;
            nxto->mcmoflg = 0;
            
            /* split the newly grown block if necessary */
            mcmsplt(ctx, obj, newsize);
        }
        else
        {
            /* can't annex; allocate new memory and copy */
            
            if (o->mcmolcnt != 1)           /* if anyone else has a lock... */
                errsig(ctx->mcmcxerr, ERR_REALCK);      /* we can't move it */
    
            p = mcmalo0(cctx, newsize, &nxt, MCMONINV, TRUE);
            if (nxt == MCMONINV) errsig(ctx->mcmcxerr, ERR_NOMEM2);
            memcpy(p, o->mcmoptr, (size_t)o->mcmosiz);
            
            /* adjust the object entries */
            nxto = mcmgobje(ctx, nxt);          /* get pointer to new entry */
            newsize = nxto->mcmosiz;        /* get actual size of new block */
            nxto->mcmoptr = o->mcmoptr;   /* copy current block info to new */
            nxto->mcmosiz = o->mcmosiz;
            o->mcmoptr = p;        /* copy new block info to original entry */
            o->mcmosiz = newsize;
            
            /* now fix up the heap pointers, and free the temp object */
            *(mcmon *)(p - osrndsz(sizeof(mcmon))) = obj;
            *(mcmon *)(nxto->mcmoptr - osrndsz(sizeof(mcmon))) = nxt;
            mcmgunlck(ctx, nxt);
            mcmgfre(ctx, nxt);
        }
    }
    
    ERRCLEAN(ctx->mcmcxerr)
        /* release our lock, if we had to obtain one */
        if (local_lock) mcmunlck(cctx, cliobj);
    ERRENDCLN(ctx->mcmcxerr)
    
    /* return the address of the object */
    return(o->mcmoptr);
}